

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

Descriptor *
cfd::core::Descriptor::Parse
          (Descriptor *__return_storage_ptr__,string *output_descriptor,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1c8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1a8;
  DescriptorNode local_188;
  
  local_1c8.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (network_parameters ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    GetBitcoinAddressFormatList();
    local_188.name_.field_2._M_allocated_capacity =
         (size_type)
         local_1c8.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_188.name_._M_string_length =
         (size_type)
         local_1c8.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_188.name_._M_dataplus._M_p =
         (pointer)local_1c8.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a8.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1a8.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1a8.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_188);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_1a8);
  }
  else {
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_1c8,network_parameters);
  }
  DescriptorNode::DescriptorNode(&__return_storage_ptr__->root_node_);
  DescriptorNode::Parse(&local_188,output_descriptor,&local_1c8);
  DescriptorNode::operator=(&__return_storage_ptr__->root_node_,&local_188);
  DescriptorNode::~DescriptorNode(&local_188);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  ~vector(&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

Descriptor Descriptor::Parse(
    const std::string& output_descriptor,
    const std::vector<AddressFormatData>* network_parameters) {
  std::vector<AddressFormatData> network_pefixes;
  if (network_parameters) {
    network_pefixes = *network_parameters;
  } else {
    network_pefixes = GetBitcoinAddressFormatList();
  }
  Descriptor desc;
  desc.root_node_ = DescriptorNode::Parse(output_descriptor, network_pefixes);
  return desc;
}